

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesStringWidget.cxx
# Opt level: O2

bool __thiscall
cmCursesStringWidget::HandleInput
          (cmCursesStringWidget *this,int *key,cmCursesMainForm *fm,WINDOW *w)

{
  char cVar1;
  FORM *form;
  int iVar2;
  ulong uVar3;
  byte bVar4;
  allocator local_d9;
  string local_d8 [32];
  char debugMessage [128];
  
  form = (fm->super_cmCursesForm).Form;
  if ((((this->super_cmCursesWidget).field_0x3c == '\0') && (*key != 0x157)) && (*key != 10)) {
LAB_002630a2:
    bVar4 = 0;
  }
  else {
    this->OriginalString = (char *)0x0;
    this->Done = false;
    bVar4 = 0;
    while ((bVar4 & 1) == 0) {
      sprintf(debugMessage,"String widget handling input, key: %d",(ulong)(uint)*key);
      cmCursesForm::LogMessage(debugMessage);
      cmCursesMainForm::PrintKeys(fm,0);
      if (((_stdscr == 0) || (*(short *)(_stdscr + 6) < 0x40)) || (*(short *)(_stdscr + 4) < 5)) {
        if (*key != 0x71) goto LAB_00262f49;
        break;
      }
      cVar1 = (this->super_cmCursesWidget).field_0x3c;
      iVar2 = *key;
      if (cVar1 == '\0') {
        if ((iVar2 == 10) || (iVar2 == 0x157)) {
switchD_00262f8d_caseD_a:
          (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[8])(this,fm,w);
          goto LAB_00263034;
        }
        break;
      }
      switch(iVar2) {
      case 1:
switchD_00262fab_caseD_106:
        iVar2 = 0x216;
        break;
      case 2:
switchD_00262fab_caseD_104:
        iVar2 = 0x211;
        break;
      case 3:
      case 7:
      case 8:
      case 0xc:
      case 0xd:
      case 0xf:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
switchD_00262f8d_caseD_3:
        (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[9])(this,key,fm,w);
        goto LAB_00263034;
      case 4:
      case 0xe:
      case 0x10:
      case 0x15:
        goto switchD_00262fab_caseD_102;
      case 5:
switchD_00262f8d_caseD_5:
        iVar2 = 0x217;
        break;
      case 6:
switchD_00262fab_caseD_105:
        iVar2 = 0x210;
        break;
      case 9:
        (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[7])(this,fm,w);
        goto LAB_00263034;
      case 10:
        goto switchD_00262f8d_caseD_a;
      case 0xb:
        iVar2 = 0x225;
        break;
      case 0x1b:
        if (cVar1 == '\0') goto LAB_00263034;
        (this->super_cmCursesWidget).field_0x3c = 0;
        cmCursesMainForm::PrintKeys(fm,0);
        std::__cxx11::string::string(local_d8,this->OriginalString,&local_d9);
        (*(this->super_cmCursesWidget)._vptr_cmCursesWidget[4])(this,local_d8);
        std::__cxx11::string::~string(local_d8);
        if (this->OriginalString != (char *)0x0) {
          operator_delete__(this->OriginalString);
        }
        if (w == (WINDOW *)0x0) {
          uVar3 = 0xffffffffffffffff;
        }
        else {
          uVar3 = (ulong)((int)w->_maxy + 1);
        }
        wtouchln(w,0,uVar3,1);
        wrefresh(w);
        bVar4 = 1;
        goto LAB_002630a4;
      default:
        switch(iVar2) {
        case 0x102:
        case 0x103:
          break;
        case 0x104:
          goto switchD_00262fab_caseD_104;
        case 0x105:
          goto switchD_00262fab_caseD_105;
        case 0x106:
          goto switchD_00262fab_caseD_106;
        case 0x107:
switchD_00262fab_caseD_107:
          if (0 < form->curcol) {
            iVar2 = 0x222;
            goto LAB_0026302f;
          }
          goto LAB_00263034;
        default:
          if (iVar2 == 0x7f) goto switchD_00262fab_caseD_107;
          if (iVar2 == 0x14a) {
            if (-1 < form->curcol) {
              iVar2 = 0x221;
              goto LAB_0026302f;
            }
            goto LAB_00263034;
          }
          if (iVar2 == 0x157) goto switchD_00262f8d_caseD_a;
          if (iVar2 == 0x168) goto switchD_00262f8d_caseD_5;
          if (1 < iVar2 - 0x152U) goto switchD_00262f8d_caseD_3;
        }
        goto switchD_00262fab_caseD_102;
      }
LAB_0026302f:
      form_driver((FORM_conflict *)form,iVar2);
LAB_00263034:
      if (this->Done == false) {
        uVar3 = 0xffffffffffffffff;
        if (w != (WINDOW *)0x0) {
          uVar3 = (ulong)((int)w->_maxy + 1);
        }
        wtouchln(w,0,uVar3,1);
        wrefresh(w);
LAB_00262f49:
        iVar2 = wgetch(_stdscr);
        *key = iVar2;
      }
      bVar4 = this->Done;
    }
  }
LAB_002630a4:
  return (bool)(bVar4 & 1);
switchD_00262fab_caseD_102:
  (this->super_cmCursesWidget).field_0x3c = 0;
  if (this->OriginalString != (char *)0x0) {
    operator_delete__(this->OriginalString);
  }
  form_driver((FORM_conflict *)form,0x204);
  form_driver((FORM_conflict *)form,0x205);
  goto LAB_002630a2;
}

Assistant:

bool cmCursesStringWidget::HandleInput(int& key, cmCursesMainForm* fm,
                                       WINDOW* w)
{
  int x,y;

  FORM* form = fm->GetForm();
  // 10 == enter
  if (!this->InEdit && ( key != 10 && key != KEY_ENTER ) )
    {
    return false;
    }

  this->OriginalString=0;
  this->Done = false;

  char debugMessage[128];

  // <Enter> is used to change edit mode (like <Esc> in vi).
  while(!this->Done)
    {
    sprintf(debugMessage, "String widget handling input, key: %d", key);
    cmCursesForm::LogMessage(debugMessage);

    fm->PrintKeys();

    getmaxyx(stdscr, y, x);
    // If window too small, handle 'q' only
    if ( x < cmCursesMainForm::MIN_WIDTH  ||
         y < cmCursesMainForm::MIN_HEIGHT )
      {
      // quit
      if ( key == 'q' )
        {
        return false;
        }
      else
        {
        key=getch();
        continue;
        }
      }

    // If resize occured during edit, move out of edit mode
    if (!this->InEdit && ( key != 10 && key != KEY_ENTER ) )
      {
      return false;
      }
    // 10 == enter
    if (key == 10 || key == KEY_ENTER)
      {
      this->OnReturn(fm, w);
      }
    else if ( key == KEY_DOWN || key == ctrl('n') ||
              key == KEY_UP || key == ctrl('p') ||
              key == KEY_NPAGE || key == ctrl('d') ||
              key == KEY_PPAGE || key == ctrl('u'))
      {
      this->InEdit = false;
      delete[] this->OriginalString;
      // trick to force forms to update the field buffer
      form_driver(form, REQ_NEXT_FIELD);
      form_driver(form, REQ_PREV_FIELD);
      return false;
      }
    // esc
    else if (key == 27)
      {
      if (this->InEdit)
        {
        this->InEdit = false;
        fm->PrintKeys();
        this->SetString(this->OriginalString);
        delete[] this->OriginalString;
        touchwin(w);
        wrefresh(w);
        return true;
        }
      }
    else if ( key == 9 )
      {
      this->OnTab(fm, w);
      }
    else if ( key == KEY_LEFT || key == ctrl('b') )
      {
      form_driver(form, REQ_PREV_CHAR);
      }
    else if ( key == KEY_RIGHT || key == ctrl('f') )
      {
      form_driver(form, REQ_NEXT_CHAR);
      }
    else if ( key == ctrl('k') )
      {
      form_driver(form, REQ_CLR_EOL);
      }
    else if ( key == ctrl('a') || key == KEY_HOME )
      {
      form_driver(form, REQ_BEG_FIELD);
      }
    else if ( key == ctrl('e') || key == KEY_END )
      {
      form_driver(form, REQ_END_FIELD);
      }
    else if ( key == 127 ||
              key == KEY_BACKSPACE )
      {
      if ( form->curcol > 0 )
        {
        form_driver(form, REQ_DEL_PREV);
        }
      }
    else if ( key == ctrl('d') ||key == KEY_DC )
      {
      if ( form->curcol >= 0 )
        {
        form_driver(form, REQ_DEL_CHAR);
        }
      }
    else
      {
      this->OnType(key, fm, w);
      }
    if ( !this->Done )
      {
      touchwin(w);
      wrefresh(w);

      key=getch();
      }
    }
  return true;
}